

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O1

int secp256k1_musig_nonce_gen_internal
              (secp256k1_context *ctx,secp256k1_musig_secnonce *secnonce,
              secp256k1_musig_pubnonce *pubnonce,uchar *input_nonce,uchar *seckey,
              secp256k1_pubkey *pubkey,uchar *msg32,secp256k1_musig_keyagg_cache *keyagg_cache,
              uchar *extra_input32)

{
  uint *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  uint uVar184;
  uint uVar185;
  uint uVar186;
  uint uVar187;
  uint uVar188;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  secp256k1_musig_secnonce *secnonce_00;
  secp256k1_musig_pubnonce *psVar192;
  int iVar193;
  long lVar194;
  ulong uVar195;
  long lVar196;
  uint uVar197;
  secp256k1_scalar *psVar198;
  uchar *r;
  secp256k1_sha256 *psVar199;
  secp256k1_sha256 *psVar200;
  secp256k1_context *psVar201;
  secp256k1_gej *a;
  ulong uVar202;
  secp256k1_sha256 *hash;
  byte bVar203;
  uchar msg_present;
  uchar rand [32];
  size_t pk_ser_len;
  uchar buf [32];
  secp256k1_gej nonce_ptj [2];
  secp256k1_ge nonce_pts [2];
  uchar pk_ser [33];
  secp256k1_scalar k [2];
  secp256k1_ge pk;
  uchar aggpk_ser [32];
  uchar local_401;
  secp256k1_musig_secnonce *local_400;
  uint64_t *local_3f8;
  ulong local_3f0;
  long local_3e8;
  ulong local_3e0;
  ulong local_3d8;
  ulong local_3d0;
  ulong local_3c8;
  ulong local_3c0;
  ulong local_3b8;
  ulong local_3b0;
  ulong local_3a8;
  ulong local_3a0;
  undefined1 local_398 [16];
  ulong local_388;
  ulong local_380;
  ulong local_378;
  ulong local_370;
  uint local_368;
  uchar local_361;
  ulong local_360;
  undefined8 local_358;
  secp256k1_context *local_350;
  secp256k1_fe local_348;
  undefined8 local_320;
  undefined8 local_310;
  secp256k1_musig_pubnonce *local_308;
  size_t local_300;
  uchar local_2f8 [32];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  uint64_t local_2b8 [2];
  uint64_t local_2a8 [2];
  uint64_t local_298 [2];
  ulong local_288;
  ulong uStack_280;
  ulong local_278;
  ulong uStack_270;
  ulong local_268 [12];
  ulong local_208;
  ulong local_200;
  ulong local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  undefined1 local_1d8 [8];
  undefined8 uStack_1d0;
  ulong local_1c8;
  ulong uStack_1c0;
  ulong local_1b8;
  uchar auStack_1b0 [48];
  secp256k1_fe asStack_180 [2];
  uchar local_128 [48];
  secp256k1_scalar local_f8;
  secp256k1_scalar local_d8;
  secp256k1_ge local_b0;
  uchar local_58 [40];
  
  bVar203 = 0;
  local_300 = 0x21;
  if (((pubnonce == (secp256k1_musig_pubnonce *)0x0) ||
      (memset(pubnonce,0,0x84), pubkey == (secp256k1_pubkey *)0x0)) ||
     ((ctx->ecmult_gen_ctx).built == 0)) {
    secp256k1_musig_nonce_gen_internal_cold_1();
    uVar197 = 0;
  }
  else {
    local_400 = secnonce;
    local_3f8 = (uint64_t *)input_nonce;
    local_350 = ctx;
    if (seckey == (uchar *)0x0) {
      local_368 = 1;
    }
    else {
      secp256k1_scalar_set_b32((secp256k1_scalar *)local_2d8,seckey,(int *)local_1d8);
      local_368 = (uint)(((local_2d8._8_8_ != 0 || local_2c8._8_8_ != 0) ||
                         (local_2d8._0_8_ != 0 || local_2c8._0_8_ != 0)) && local_1d8._0_4_ == 0);
      local_2d8 = (undefined1  [16])0x0;
      local_2c8 = (undefined1  [16])0x0;
    }
    r = (uchar *)0x0;
    if (keyagg_cache != (secp256k1_musig_keyagg_cache *)0x0) {
      iVar193 = secp256k1_keyagg_cache_load
                          (local_350,(secp256k1_keyagg_cache_internal *)local_2d8,keyagg_cache);
      if (iVar193 == 0) {
        return 0;
      }
      r = local_58;
      secp256k1_fe_impl_get_b32(r,(secp256k1_fe *)local_2d8);
    }
    iVar193 = secp256k1_pubkey_load(local_350,&local_b0,pubkey);
    uVar197 = 0;
    if (iVar193 != 0) {
      secp256k1_eckey_pubkey_serialize(&local_b0,local_128,&local_300,1);
      if (seckey == (uchar *)0x0) {
        local_348.n[0] = *local_3f8;
        local_348.n[1] = local_3f8[1];
        local_348.n[2] = local_3f8[2];
        local_348.n[3] = local_3f8[3];
      }
      else {
        local_2d8._0_8_ = 0xf463fe7ea19e884b;
        local_2d8._8_8_ = 0xbeb0f9ff2f18f9a2;
        local_2c8._0_8_ = 0x6ebd26f0f37e8b0;
        local_2c8._8_8_ = 0x522fb150e3b243d2;
        local_278 = 0x40;
        secp256k1_sha256_write((secp256k1_sha256 *)local_2d8,(uchar *)local_3f8,0x20);
        secp256k1_sha256_finalize((secp256k1_sha256 *)local_2d8,(uchar *)&local_348);
        lVar194 = 0;
        do {
          puVar1 = (uint *)(seckey + lVar194);
          uVar197 = puVar1[1];
          uVar184 = puVar1[2];
          uVar185 = puVar1[3];
          uVar186 = *(uint *)((long)local_348.n + lVar194 + 4);
          uVar187 = *(uint *)((long)local_348.n + lVar194 + 8);
          uVar188 = *(uint *)((long)local_348.n + lVar194 + 0xc);
          *(uint *)((long)local_348.n + lVar194) = *puVar1 ^ *(uint *)((long)local_348.n + lVar194);
          *(uint *)((long)local_348.n + lVar194 + 4) = uVar197 ^ uVar186;
          *(uint *)((long)local_348.n + lVar194 + 8) = uVar184 ^ uVar187;
          *(uint *)((long)local_348.n + lVar194 + 0xc) = uVar185 ^ uVar188;
          lVar194 = lVar194 + 0x10;
        } while (lVar194 != 0x20);
        local_401 = ' ';
      }
      local_2d8._8_8_ = 0xe6258ee0391bc43;
      local_2d8._0_8_ = 0x1800341407101b64;
      local_2c8._8_8_ = 0xff568a30b7a0a4fb;
      local_2c8._0_8_ = 0x8343937e29d26b72;
      local_278 = 0x40;
      local_308 = pubnonce;
      secp256k1_sha256_write((secp256k1_sha256 *)local_2d8,(uchar *)&local_348,0x20);
      secp256k1_nonce_function_musig_helper((secp256k1_sha256 *)local_2d8,1,local_128,'!');
      secp256k1_nonce_function_musig_helper((secp256k1_sha256 *)local_2d8,1,r,' ');
      local_361 = msg32 != (uchar *)0x0;
      secp256k1_sha256_write((secp256k1_sha256 *)local_2d8,&local_361,1);
      if (msg32 != (uchar *)0x0) {
        secp256k1_nonce_function_musig_helper((secp256k1_sha256 *)local_2d8,8,msg32,' ');
      }
      secp256k1_nonce_function_musig_helper((secp256k1_sha256 *)local_2d8,4,extra_input32,' ');
      local_401 = '\0';
      lVar194 = -1;
      psVar198 = &local_f8;
      hash = (secp256k1_sha256 *)local_1d8;
      do {
        psVar199 = (secp256k1_sha256 *)local_2d8;
        psVar200 = hash;
        for (lVar196 = 0xd; lVar196 != 0; lVar196 = lVar196 + -1) {
          *(undefined8 *)psVar200->s = *(undefined8 *)psVar199->s;
          psVar199 = (secp256k1_sha256 *)((long)psVar199 + (ulong)bVar203 * -0x10 + 8);
          psVar200 = (secp256k1_sha256 *)((long)psVar200 + (ulong)bVar203 * -0x10 + 8);
        }
        secp256k1_sha256_write(hash,&local_401,1);
        secp256k1_sha256_finalize(hash,local_2f8);
        secp256k1_scalar_set_b32(psVar198,local_2f8,(int *)0x0);
        secnonce_00 = local_400;
        local_2f8[0x10] = '\0';
        local_2f8[0x11] = '\0';
        local_2f8[0x12] = '\0';
        local_2f8[0x13] = '\0';
        local_2f8[0x14] = '\0';
        local_2f8[0x15] = '\0';
        local_2f8[0x16] = '\0';
        local_2f8[0x17] = '\0';
        local_2f8[0x18] = '\0';
        local_2f8[0x19] = '\0';
        local_2f8[0x1a] = '\0';
        local_2f8[0x1b] = '\0';
        local_2f8[0x1c] = '\0';
        local_2f8[0x1d] = '\0';
        local_2f8[0x1e] = '\0';
        local_2f8[0x1f] = '\0';
        local_2f8[0] = '\0';
        local_2f8[1] = '\0';
        local_2f8[2] = '\0';
        local_2f8[3] = '\0';
        local_2f8[4] = '\0';
        local_2f8[5] = '\0';
        local_2f8[6] = '\0';
        local_2f8[7] = '\0';
        local_2f8[8] = '\0';
        local_2f8[9] = '\0';
        local_2f8[10] = '\0';
        local_2f8[0xb] = '\0';
        local_2f8[0xc] = '\0';
        local_2f8[0xd] = '\0';
        local_2f8[0xe] = '\0';
        local_2f8[0xf] = '\0';
        auStack_1b0[0x28] = '\0';
        auStack_1b0[0x29] = '\0';
        auStack_1b0[0x2a] = '\0';
        auStack_1b0[0x2b] = '\0';
        auStack_1b0[0x2c] = '\0';
        auStack_1b0[0x2d] = '\0';
        auStack_1b0[0x2e] = '\0';
        auStack_1b0[0x2f] = '\0';
        asStack_180[0].n[0]._0_1_ = '\0';
        asStack_180[0].n[0]._1_1_ = '\0';
        asStack_180[0].n[0]._2_1_ = '\0';
        asStack_180[0].n[0]._3_1_ = '\0';
        asStack_180[0].n[0]._4_1_ = '\0';
        asStack_180[0].n[0]._5_1_ = '\0';
        asStack_180[0].n[0]._6_1_ = '\0';
        asStack_180[0].n[0]._7_1_ = '\0';
        auStack_1b0[0x18] = '\0';
        auStack_1b0[0x19] = '\0';
        auStack_1b0[0x1a] = '\0';
        auStack_1b0[0x1b] = '\0';
        auStack_1b0[0x1c] = '\0';
        auStack_1b0[0x1d] = '\0';
        auStack_1b0[0x1e] = '\0';
        auStack_1b0[0x1f] = '\0';
        auStack_1b0[0x20] = '\0';
        auStack_1b0[0x21] = '\0';
        auStack_1b0[0x22] = '\0';
        auStack_1b0[0x23] = '\0';
        auStack_1b0[0x24] = '\0';
        auStack_1b0[0x25] = '\0';
        auStack_1b0[0x26] = '\0';
        auStack_1b0[0x27] = '\0';
        auStack_1b0[8] = '\0';
        auStack_1b0[9] = '\0';
        auStack_1b0[10] = '\0';
        auStack_1b0[0xb] = '\0';
        auStack_1b0[0xc] = '\0';
        auStack_1b0[0xd] = '\0';
        auStack_1b0[0xe] = '\0';
        auStack_1b0[0xf] = '\0';
        auStack_1b0[0x10] = '\0';
        auStack_1b0[0x11] = '\0';
        auStack_1b0[0x12] = '\0';
        auStack_1b0[0x13] = '\0';
        auStack_1b0[0x14] = '\0';
        auStack_1b0[0x15] = '\0';
        auStack_1b0[0x16] = '\0';
        auStack_1b0[0x17] = '\0';
        local_1b8._0_1_ = '\0';
        local_1b8._1_1_ = '\0';
        local_1b8._2_1_ = '\0';
        local_1b8._3_1_ = '\0';
        local_1b8._4_1_ = '\0';
        local_1b8._5_1_ = '\0';
        local_1b8._6_1_ = '\0';
        local_1b8._7_1_ = '\0';
        auStack_1b0[0] = '\0';
        auStack_1b0[1] = '\0';
        auStack_1b0[2] = '\0';
        auStack_1b0[3] = '\0';
        auStack_1b0[4] = '\0';
        auStack_1b0[5] = '\0';
        auStack_1b0[6] = '\0';
        auStack_1b0[7] = '\0';
        local_1c8._0_4_ = 0;
        local_1c8._4_4_ = 0;
        uStack_1c0._0_4_ = 0;
        uStack_1c0._4_4_ = 0;
        local_1d8._0_4_ = 0;
        local_1d8._4_4_ = 0;
        uStack_1d0._0_4_ = 0;
        uStack_1d0._4_4_ = 0;
        asStack_180[0].n[1] = 0;
        local_401 = (char)lVar194 + '\x02';
        psVar198 = psVar198 + 1;
        lVar194 = lVar194 + 1;
      } while (lVar194 == 0);
      local_348.n[2] = 0;
      local_348.n[3] = 0;
      local_348.n[0] = 0;
      local_348.n[1] = 0;
      a = (secp256k1_gej *)local_2d8;
      local_288 = 0;
      uStack_280 = 0;
      local_298[0] = 0;
      local_298[1] = 0;
      local_2a8[0] = 0;
      local_2a8[1] = 0;
      local_2b8[0] = 0;
      local_2b8[1] = 0;
      local_2c8 = ZEXT816(0);
      local_2d8 = ZEXT816(0);
      local_278 = 0;
      local_400->data[0] = '\"';
      local_400->data[1] = '\x0e';
      local_400->data[2] = 0xdc;
      local_400->data[3] = 0xf1;
      psVar198 = &local_f8;
      secp256k1_scalar_get_b32(local_400->data + 4,psVar198);
      secp256k1_scalar_get_b32(secnonce_00->data + 0x24,&local_d8);
      secp256k1_ge_to_bytes(secnonce_00->data + 0x44,&local_b0);
      psVar201 = local_350;
      secp256k1_musig_secnonce_invalidate(local_350,secnonce_00,local_368 ^ 1);
      lVar194 = 0;
      do {
        secp256k1_ecmult_gen
                  (&psVar201->ecmult_gen_ctx,(secp256k1_gej *)(local_2d8 + lVar194),psVar198);
        psVar198->d[2] = 0;
        psVar198->d[3] = 0;
        psVar198->d[0] = 0;
        psVar198->d[1] = 0;
        lVar194 = lVar194 + 0x80;
        psVar198 = psVar198 + 1;
      } while (lVar194 == 0x80);
      local_1d8 = (undefined1  [8])local_288;
      uStack_1d0 = (undefined1 *)uStack_280;
      local_1c8 = local_278;
      uStack_1c0 = uStack_270;
      local_1b8 = local_268[0];
      local_400 = (secp256k1_musig_secnonce *)local_288;
      local_3c0 = local_1f0;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_1f0;
      auVar95._8_8_ = 0;
      auVar95._0_8_ = local_288;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_1f8;
      auVar96._8_8_ = 0;
      auVar96._0_8_ = uStack_280;
      local_3d0 = uStack_280;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_200;
      auVar97._8_8_ = 0;
      auVar97._0_8_ = local_278;
      local_3b0 = local_278;
      local_360 = local_208;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_208;
      auVar98._8_8_ = 0;
      auVar98._0_8_ = uStack_270;
      local_370 = uStack_270;
      local_3b8 = local_1e8;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_1e8;
      auVar99._8_8_ = 0;
      auVar99._0_8_ = local_268[0];
      local_3f8 = (uint64_t *)local_268[0];
      auVar7._8_8_ = 0;
      auVar7._0_8_ = SUB168(auVar6 * auVar99,0);
      auVar2 = auVar3 * auVar96 + auVar2 * auVar95 + auVar4 * auVar97 + auVar5 * auVar98 +
               auVar7 * ZEXT816(0x1000003d10);
      local_3a8 = auVar2._0_8_;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_1e8;
      auVar100._8_8_ = 0;
      auVar100._0_8_ = local_288;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_1f0;
      auVar101._8_8_ = 0;
      auVar101._0_8_ = uStack_280;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_1f8;
      auVar102._8_8_ = 0;
      auVar102._0_8_ = local_278;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_200;
      auVar103._8_8_ = 0;
      auVar103._0_8_ = uStack_270;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_208;
      auVar104._8_8_ = 0;
      auVar104._0_8_ = local_268[0];
      auVar13._8_8_ = 0;
      auVar13._0_8_ = SUB168(auVar6 * auVar99,8);
      auVar2 = auVar13 * ZEXT816(0x1000003d10000) +
               auVar12 * auVar104 + auVar11 * auVar103 + auVar10 * auVar102 + auVar9 * auVar101 +
               auVar8 * auVar100 + (auVar2 >> 0x34);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_208;
      auVar105._8_8_ = 0;
      auVar105._0_8_ = local_288;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_1e8;
      auVar106._8_8_ = 0;
      auVar106._0_8_ = uStack_280;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_1f0;
      auVar107._8_8_ = 0;
      auVar107._0_8_ = local_278;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_1f8;
      auVar108._8_8_ = 0;
      auVar108._0_8_ = uStack_270;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_200;
      auVar109._8_8_ = 0;
      auVar109._0_8_ = local_268[0];
      auVar3 = (auVar2 >> 0x34) +
               auVar18 * auVar109 + auVar17 * auVar108 + auVar16 * auVar107 + auVar15 * auVar106;
      uVar195 = auVar3._0_8_;
      uVar202 = auVar3._8_8_;
      auVar189._8_8_ = uVar202 >> 0x34;
      auVar189._0_8_ = uVar202 * 0x1000 | uVar195 >> 0x34;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar195 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar2._6_2_ & 0xf);
      auVar3 = auVar19 * ZEXT816(0x1000003d1) + auVar14 * auVar105;
      uVar195 = auVar3._0_8_;
      uVar202 = auVar3._8_8_;
      local_3a0 = uVar195 & 0xfffffffffffff;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_200;
      auVar110._8_8_ = 0;
      auVar110._0_8_ = local_288;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_208;
      auVar111._8_8_ = 0;
      auVar111._0_8_ = uStack_280;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_1e8;
      auVar112._8_8_ = 0;
      auVar112._0_8_ = local_278;
      local_3e8 = SUB168(auVar22 * auVar112,8);
      auVar172._8_8_ = uVar202 >> 0x34;
      auVar172._0_8_ = uVar202 * 0x1000 | uVar195 >> 0x34;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_1f0;
      auVar113._8_8_ = 0;
      auVar113._0_8_ = uStack_270;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_1f8;
      auVar114._8_8_ = 0;
      auVar114._0_8_ = local_268[0];
      auVar189 = auVar22 * auVar112 + auVar24 * auVar114 + auVar23 * auVar113 + auVar189;
      uVar202 = auVar189._0_8_;
      uVar195 = auVar189._8_8_;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = uVar202 & 0xfffffffffffff;
      local_3e0 = SUB168(auVar20 * auVar110,0);
      auVar172 = auVar25 * ZEXT816(0x1000003d10) + auVar21 * auVar111 + auVar20 * auVar110 +
                 auVar172;
      auVar173._8_8_ = uVar195 >> 0x34;
      auVar173._0_8_ = uVar195 * 0x1000 | uVar202 >> 0x34;
      asStack_180[0].n[1] = auVar172._0_8_ & 0xfffffffffffff;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_1f8;
      auVar115._8_8_ = 0;
      auVar115._0_8_ = local_288;
      auVar26 = auVar26 * auVar115;
      local_3f0 = auVar26._8_8_;
      local_3d8 = auVar26._0_8_;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_200;
      auVar116._8_8_ = 0;
      auVar116._0_8_ = uStack_280;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_208;
      auVar117._8_8_ = 0;
      auVar117._0_8_ = local_278;
      local_3c8 = SUB168(auVar28 * auVar117,8);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_1e8;
      auVar118._8_8_ = 0;
      auVar118._0_8_ = uStack_270;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_1f0;
      auVar119._8_8_ = 0;
      auVar119._0_8_ = local_268[0];
      auVar173 = auVar30 * auVar119 + auVar29 * auVar118 + auVar173;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = auVar173._0_8_;
      auVar3 = auVar31 * ZEXT816(0x1000003d10) + auVar28 * auVar117 + auVar27 * auVar116 + auVar26 +
               (auVar172 >> 0x34);
      auVar4 = auVar3 >> 0x34;
      auVar179._8_8_ = 0;
      auVar179._0_8_ = auVar4._0_8_;
      asStack_180[0].n[2] = auVar3._0_8_ & 0xfffffffffffff;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = auVar173._8_8_;
      auVar178._8_8_ = auVar4._8_8_;
      auVar178._0_8_ = local_3a8 & 0xfffffffffffff;
      auVar179 = auVar32 * ZEXT816(0x1000003d10000) + auVar178 + auVar179;
      uVar195 = auVar179._0_8_;
      asStack_180[0].n[3] = uVar195 & 0xfffffffffffff;
      asStack_180[0].n[4] =
           (auVar179._8_8_ << 0xc | uVar195 >> 0x34) + (auVar2._0_8_ & 0xffffffffffff);
      asStack_180[0].n[0] = local_3a0;
      secp256k1_fe_impl_inv(&local_348,(secp256k1_fe *)(local_1d8 + 0x58));
      local_3f0 = local_348.n[3];
      auVar33._8_8_ = 0;
      auVar33._0_8_ = local_348.n[3];
      auVar120._8_8_ = 0;
      auVar120._0_8_ = local_400;
      local_3b8 = local_348.n[2];
      auVar34._8_8_ = 0;
      auVar34._0_8_ = local_348.n[2];
      auVar121._8_8_ = 0;
      auVar121._0_8_ = local_3d0;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = local_348.n[1];
      auVar122._8_8_ = 0;
      auVar122._0_8_ = local_3b0;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = local_348.n[0];
      auVar123._8_8_ = 0;
      auVar123._0_8_ = local_370;
      local_3c8 = local_348.n[4];
      auVar37._8_8_ = 0;
      auVar37._0_8_ = local_348.n[4];
      auVar124._8_8_ = 0;
      auVar124._0_8_ = local_3f8;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = SUB168(auVar37 * auVar124,0);
      auVar4 = auVar34 * auVar121 + auVar33 * auVar120 + auVar35 * auVar122 + auVar36 * auVar123 +
               auVar38 * ZEXT816(0x1000003d10);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = local_348.n[4];
      auVar125._8_8_ = 0;
      auVar125._0_8_ = local_400;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = local_348.n[3];
      auVar126._8_8_ = 0;
      auVar126._0_8_ = local_3d0;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = local_348.n[2];
      auVar127._8_8_ = 0;
      auVar127._0_8_ = local_3b0;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = local_348.n[1];
      auVar128._8_8_ = 0;
      auVar128._0_8_ = local_370;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = local_348.n[0];
      auVar129._8_8_ = 0;
      auVar129._0_8_ = local_3f8;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = SUB168(auVar37 * auVar124,8);
      auVar2 = auVar44 * ZEXT816(0x1000003d10000) +
               auVar43 * auVar129 + auVar42 * auVar128 + auVar41 * auVar127 + auVar40 * auVar126 +
               auVar39 * auVar125 + (auVar4 >> 0x34);
      auVar45._8_8_ = 0;
      auVar45._0_8_ = local_348.n[0];
      auVar130._8_8_ = 0;
      auVar130._0_8_ = local_400;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = local_348.n[4];
      auVar131._8_8_ = 0;
      auVar131._0_8_ = local_3d0;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = local_348.n[3];
      auVar132._8_8_ = 0;
      auVar132._0_8_ = local_3b0;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = local_348.n[2];
      auVar133._8_8_ = 0;
      auVar133._0_8_ = local_370;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = local_348.n[1];
      auVar134._8_8_ = 0;
      auVar134._0_8_ = local_3f8;
      auVar3 = (auVar2 >> 0x34) +
               auVar49 * auVar134 + auVar48 * auVar133 + auVar47 * auVar132 + auVar46 * auVar131;
      uVar195 = auVar3._0_8_;
      uVar202 = auVar3._8_8_;
      auVar190._8_8_ = uVar202 >> 0x34;
      auVar190._0_8_ = uVar202 * 0x1000 | uVar195 >> 0x34;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = uVar195 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar2._6_2_ & 0xf);
      auVar3 = auVar50 * ZEXT816(0x1000003d1) + auVar45 * auVar130;
      uVar195 = auVar3._0_8_;
      uVar202 = auVar3._8_8_;
      asStack_180[0].n[0] = uVar195 & 0xfffffffffffff;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = local_348.n[1];
      auVar135._8_8_ = 0;
      auVar135._0_8_ = local_400;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = local_348.n[0];
      auVar136._8_8_ = 0;
      auVar136._0_8_ = local_3d0;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = local_348.n[4];
      auVar137._8_8_ = 0;
      auVar137._0_8_ = local_3b0;
      auVar174._8_8_ = uVar202 >> 0x34;
      auVar174._0_8_ = uVar202 * 0x1000 | uVar195 >> 0x34;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = local_348.n[3];
      auVar138._8_8_ = 0;
      auVar138._0_8_ = local_370;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = local_348.n[2];
      auVar139._8_8_ = 0;
      auVar139._0_8_ = local_3f8;
      auVar190 = auVar53 * auVar137 + auVar55 * auVar139 + auVar54 * auVar138 + auVar190;
      uVar195 = auVar190._0_8_;
      uVar202 = auVar190._8_8_;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = uVar195 & 0xfffffffffffff;
      auVar174 = auVar56 * ZEXT816(0x1000003d10) + auVar52 * auVar136 + auVar51 * auVar135 +
                 auVar174;
      auVar175._8_8_ = uVar202 >> 0x34;
      auVar175._0_8_ = uVar202 * 0x1000 | uVar195 >> 0x34;
      asStack_180[0].n[1] = auVar174._0_8_ & 0xfffffffffffff;
      local_3d8 = asStack_180[0].n[0];
      local_3e0 = asStack_180[0].n[1];
      auVar57._8_8_ = 0;
      auVar57._0_8_ = local_348.n[2];
      auVar140._8_8_ = 0;
      auVar140._0_8_ = local_400;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = local_348.n[1];
      auVar141._8_8_ = 0;
      auVar141._0_8_ = local_3d0;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = local_348.n[0];
      auVar142._8_8_ = 0;
      auVar142._0_8_ = local_3b0;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = local_348.n[4];
      auVar143._8_8_ = 0;
      auVar143._0_8_ = local_370;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = local_348.n[3];
      auVar144._8_8_ = 0;
      auVar144._0_8_ = local_3f8;
      auVar175 = auVar61 * auVar144 + auVar60 * auVar143 + auVar175;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = auVar175._0_8_;
      auVar3 = auVar62 * ZEXT816(0x1000003d10) +
               auVar59 * auVar142 + auVar57 * auVar140 + auVar58 * auVar141 + (auVar174 >> 0x34);
      auVar5 = auVar3 >> 0x34;
      auVar181._8_8_ = 0;
      auVar181._0_8_ = auVar5._0_8_;
      local_370 = auVar3._0_8_ & 0xfffffffffffff;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = auVar175._8_8_;
      auVar180._8_8_ = auVar5._8_8_;
      auVar180._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
      auVar181 = auVar63 * ZEXT816(0x1000003d10000) + auVar180 + auVar181;
      local_3a0 = auVar181._0_8_;
      local_3f8 = (uint64_t *)local_1f0;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = local_1f0;
      auVar145._8_8_ = 0;
      auVar145._0_8_ = local_348.n[0];
      auVar65._8_8_ = 0;
      auVar65._0_8_ = local_1f8;
      auVar146._8_8_ = 0;
      auVar146._0_8_ = local_348.n[1];
      auVar66._8_8_ = 0;
      auVar66._0_8_ = local_200;
      auVar147._8_8_ = 0;
      auVar147._0_8_ = local_348.n[2];
      local_310 = SUB168(auVar66 * auVar147,0);
      auVar67._8_8_ = 0;
      auVar67._0_8_ = local_348.n[3];
      auVar148._8_8_ = 0;
      auVar148._0_8_ = local_360;
      local_3e8 = (auVar181._8_8_ << 0xc | local_3a0 >> 0x34) + (auVar2._0_8_ & 0xffffffffffff);
      local_3b0 = local_1e8;
      auVar68._8_8_ = 0;
      auVar68._0_8_ = local_1e8;
      auVar149._8_8_ = 0;
      auVar149._0_8_ = local_348.n[4];
      auVar69._8_8_ = 0;
      auVar69._0_8_ = SUB168(auVar68 * auVar149,0);
      local_3a0 = local_3a0 & 0xfffffffffffff;
      auVar2 = auVar69 * ZEXT816(0x1000003d10) +
               auVar66 * auVar147 + auVar65 * auVar146 + auVar64 * auVar145 + auVar67 * auVar148;
      local_378 = auVar2._0_8_;
      auVar70._8_8_ = 0;
      auVar70._0_8_ = local_1e8;
      auVar150._8_8_ = 0;
      auVar150._0_8_ = local_348.n[0];
      auVar71._8_8_ = 0;
      auVar71._0_8_ = local_1f0;
      auVar151._8_8_ = 0;
      auVar151._0_8_ = local_348.n[1];
      auVar72._8_8_ = 0;
      auVar72._0_8_ = local_1f8;
      auVar152._8_8_ = 0;
      auVar152._0_8_ = local_348.n[2];
      auVar73._8_8_ = 0;
      auVar73._0_8_ = local_200;
      auVar153._8_8_ = 0;
      auVar153._0_8_ = local_348.n[3];
      auVar74._8_8_ = 0;
      auVar74._0_8_ = local_348.n[4];
      auVar154._8_8_ = 0;
      auVar154._0_8_ = local_360;
      auVar75._8_8_ = 0;
      auVar75._0_8_ = SUB168(auVar68 * auVar149,8);
      auVar2 = auVar75 * ZEXT816(0x1000003d10000) +
               auVar70 * auVar150 +
               auVar73 * auVar153 + auVar72 * auVar152 + auVar71 * auVar151 + auVar74 * auVar154 +
               (auVar2 >> 0x34);
      auVar76._8_8_ = 0;
      auVar76._0_8_ = local_348.n[0];
      auVar155._8_8_ = 0;
      auVar155._0_8_ = local_360;
      auVar77._8_8_ = 0;
      auVar77._0_8_ = local_1e8;
      auVar156._8_8_ = 0;
      auVar156._0_8_ = local_348.n[1];
      auVar78._8_8_ = 0;
      auVar78._0_8_ = local_1f0;
      auVar157._8_8_ = 0;
      auVar157._0_8_ = local_348.n[2];
      auVar79._8_8_ = 0;
      auVar79._0_8_ = local_1f8;
      auVar158._8_8_ = 0;
      auVar158._0_8_ = local_348.n[3];
      auVar80._8_8_ = 0;
      auVar80._0_8_ = local_200;
      auVar159._8_8_ = 0;
      auVar159._0_8_ = local_348.n[4];
      auVar3 = (auVar2 >> 0x34) +
               auVar77 * auVar156 + auVar80 * auVar159 + auVar79 * auVar158 + auVar78 * auVar157;
      uVar195 = auVar3._0_8_;
      uVar202 = auVar3._8_8_;
      local_388 = uVar202 >> 0x34;
      auVar191._8_8_ = local_388;
      auVar191._0_8_ = uVar202 * 0x1000 | uVar195 >> 0x34;
      auVar81._8_8_ = 0;
      auVar81._0_8_ = uVar195 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar2._6_2_ & 0xf);
      auVar3 = auVar76 * auVar155 + auVar81 * ZEXT816(0x1000003d1);
      uVar195 = auVar3._0_8_;
      uVar202 = auVar3._8_8_;
      local_380 = uVar195 & 0xfffffffffffff;
      auVar82._8_8_ = 0;
      auVar82._0_8_ = local_200;
      auVar160._8_8_ = 0;
      auVar160._0_8_ = local_348.n[0];
      local_398 = auVar82 * auVar160;
      auVar83._8_8_ = 0;
      auVar83._0_8_ = local_348.n[1];
      auVar161._8_8_ = 0;
      auVar161._0_8_ = local_360;
      auVar84._8_8_ = 0;
      auVar84._0_8_ = local_1e8;
      auVar162._8_8_ = 0;
      auVar162._0_8_ = local_348.n[2];
      local_358 = SUB168(auVar84 * auVar162,8);
      auVar176._8_8_ = uVar202 >> 0x34;
      auVar176._0_8_ = uVar202 * 0x1000 | uVar195 >> 0x34;
      auVar85._8_8_ = 0;
      auVar85._0_8_ = local_1f0;
      auVar163._8_8_ = 0;
      auVar163._0_8_ = local_348.n[3];
      auVar86._8_8_ = 0;
      auVar86._0_8_ = local_1f8;
      auVar164._8_8_ = 0;
      auVar164._0_8_ = local_348.n[4];
      auVar191 = auVar84 * auVar162 + auVar86 * auVar164 + auVar85 * auVar163 + auVar191;
      uVar202 = auVar191._0_8_;
      uVar195 = auVar191._8_8_;
      auVar87._8_8_ = 0;
      auVar87._0_8_ = uVar202 & 0xfffffffffffff;
      auVar176 = auVar87 * ZEXT816(0x1000003d10) + auVar83 * auVar161 + local_398 + auVar176;
      auVar177._8_8_ = uVar195 >> 0x34;
      auVar177._0_8_ = uVar195 * 0x1000 | uVar202 >> 0x34;
      uStack_1d0 = (undefined1 *)(auVar176._0_8_ & 0xfffffffffffff);
      auVar88._8_8_ = 0;
      auVar88._0_8_ = local_1f8;
      auVar165._8_8_ = 0;
      auVar165._0_8_ = local_348.n[0];
      auVar170 = auVar88 * auVar165;
      auVar89._8_8_ = 0;
      auVar89._0_8_ = local_200;
      auVar166._8_8_ = 0;
      auVar166._0_8_ = local_348.n[1];
      auVar171 = auVar89 * auVar166;
      auVar90._8_8_ = 0;
      auVar90._0_8_ = local_348.n[2];
      auVar167._8_8_ = 0;
      auVar167._0_8_ = local_360;
      auVar91._8_8_ = 0;
      auVar91._0_8_ = local_1e8;
      auVar168._8_8_ = 0;
      auVar168._0_8_ = local_348.n[3];
      auVar92._8_8_ = 0;
      auVar92._0_8_ = local_1f0;
      auVar169._8_8_ = 0;
      auVar169._0_8_ = local_348.n[4];
      auVar177 = auVar92 * auVar169 + auVar91 * auVar168 + auVar177;
      auVar93._8_8_ = 0;
      auVar93._0_8_ = auVar177._0_8_;
      auVar3 = auVar93 * ZEXT816(0x1000003d10) + auVar171 + auVar170 + auVar90 * auVar167 +
               (auVar176 >> 0x34);
      auVar4 = auVar3 >> 0x34;
      auVar183._8_8_ = 0;
      auVar183._0_8_ = auVar4._0_8_;
      local_348.n[2] = auVar3._0_8_ & 0xfffffffffffff;
      auVar94._8_8_ = 0;
      auVar94._0_8_ = auVar177._8_8_;
      auVar182._8_8_ = auVar4._8_8_;
      auVar182._0_8_ = local_378 & 0xfffffffffffff;
      auVar183 = auVar94 * ZEXT816(0x1000003d10000) + auVar182 + auVar183;
      uVar195 = auVar183._0_8_;
      local_348.n[3] = uVar195 & 0xfffffffffffff;
      local_348.n[4] = (auVar183._8_8_ << 0xc | uVar195 >> 0x34) + (auVar2._0_8_ & 0xffffffffffff);
      lVar194 = 0;
      local_348.n[0] = local_380;
      local_348.n[1] = (uint64_t)uStack_1d0;
      local_1d8 = (undefined1  [8])local_380;
      local_1c8 = local_348.n[2];
      uStack_1c0 = local_348.n[3];
      local_1b8 = local_348.n[4];
      asStack_180[0].n[2] = local_370;
      asStack_180[0].n[3] = local_3a0;
      asStack_180[0].n[4] = local_3e8;
      do {
        local_3d0 = auVar171._8_8_;
        local_3a8 = auVar171._0_8_;
        local_400 = auVar170._8_8_;
        local_3c0 = auVar170._0_8_;
        secp256k1_ge_set_gej_zinv
                  ((secp256k1_ge *)(local_1d8 + lVar194),a,(secp256k1_fe *)(local_1d8 + lVar194));
        psVar192 = local_308;
        auVar171._8_8_ = local_3d0;
        auVar171._0_8_ = local_3a8;
        auVar170._8_8_ = local_400;
        auVar170._0_8_ = local_3c0;
        lVar194 = lVar194 + 0x58;
        a = a + 1;
      } while (lVar194 == 0x58);
      lVar194 = 0;
      do {
        *(undefined1 (*) [16])((long)local_268 + lVar194) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])((long)&local_278 + lVar194) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])((long)&local_288 + lVar194) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])((long)local_298 + lVar194) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])((long)local_2a8 + lVar194) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])((long)local_2b8 + lVar194) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(local_2c8 + lVar194) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(local_2d8 + lVar194) = (undefined1  [16])0x0;
        lVar194 = lVar194 + 0x80;
      } while (lVar194 == 0x80);
      lVar194 = 0;
      psVar201 = local_350;
      do {
        if (psVar201->declassify != 0) {
          local_348.n[0] = 0x4d430002;
          local_348.n[1] = (uint64_t)(local_1d8 + lVar194);
          local_348.n[2] = 0x58;
          local_348.n[3] = 0;
          local_348.n[4] = 0;
          local_320 = 0;
          uVar195 = (ulong)((long)psVar201 << 3) >> 0x33;
          uVar202 = (((long)psVar201 << 3 | (ulong)psVar201 >> 0x3d) << 0xd | uVar195) >> 3;
          psVar201 = (secp256k1_context *)(uVar202 << 0x33 | (uVar195 << 0x3d | uVar202) >> 0xd);
          local_2f8[0] = '\0';
          local_2f8[1] = '\0';
          local_2f8[2] = '\0';
          local_2f8[3] = '\0';
          local_2f8[4] = '\0';
          local_2f8[5] = '\0';
          local_2f8[6] = '\0';
          local_2f8[7] = '\0';
        }
        lVar194 = lVar194 + 0x58;
      } while (lVar194 == 0x58);
      local_308->data[0] = 0xf5;
      local_308->data[1] = 'z';
      local_308->data[2] = '=';
      local_308->data[3] = 0xa0;
      lVar194 = 0;
      do {
        secp256k1_ge_to_bytes(psVar192->data + lVar194 + 4,(secp256k1_ge *)hash);
        lVar194 = lVar194 + 0x40;
        hash = (secp256k1_sha256 *)(hash->buf + 0x38);
        uVar197 = local_368;
      } while (lVar194 == 0x40);
    }
  }
  return uVar197;
}

Assistant:

static int secp256k1_musig_nonce_gen_internal(const secp256k1_context* ctx, secp256k1_musig_secnonce *secnonce, secp256k1_musig_pubnonce *pubnonce, const unsigned char *input_nonce, const unsigned char *seckey, const secp256k1_pubkey *pubkey, const unsigned char *msg32, const secp256k1_musig_keyagg_cache *keyagg_cache, const unsigned char *extra_input32) {
    secp256k1_scalar k[2];
    secp256k1_ge nonce_pts[2];
    secp256k1_gej nonce_ptj[2];
    int i;
    unsigned char pk_ser[33];
    size_t pk_ser_len = sizeof(pk_ser);
    unsigned char aggpk_ser[32];
    unsigned char *aggpk_ser_ptr = NULL;
    secp256k1_ge pk;
    int pk_serialize_success;
    int ret = 1;

    ARG_CHECK(pubnonce != NULL);
    memset(pubnonce, 0, sizeof(*pubnonce));
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));

    /* Check that the seckey is valid to be able to sign for it later. */
    if (seckey != NULL) {
        secp256k1_scalar sk;
        ret &= secp256k1_scalar_set_b32_seckey(&sk, seckey);
        secp256k1_scalar_clear(&sk);
    }

    if (keyagg_cache != NULL) {
        secp256k1_keyagg_cache_internal cache_i;
        if (!secp256k1_keyagg_cache_load(ctx, &cache_i, keyagg_cache)) {
            return 0;
        }
        /* The loaded point cache_i.pk can not be the point at infinity. */
        secp256k1_fe_get_b32(aggpk_ser, &cache_i.pk.x);
        aggpk_ser_ptr = aggpk_ser;
    }
    if (!secp256k1_pubkey_load(ctx, &pk, pubkey)) {
        return 0;
    }
    pk_serialize_success = secp256k1_eckey_pubkey_serialize(&pk, pk_ser, &pk_ser_len, 1);

#ifdef VERIFY
    /* A pubkey cannot be the point at infinity */
    VERIFY_CHECK(pk_serialize_success);
    VERIFY_CHECK(pk_ser_len == sizeof(pk_ser));
#else
    (void) pk_serialize_success;
#endif

    secp256k1_nonce_function_musig(k, input_nonce, msg32, seckey, pk_ser, aggpk_ser_ptr, extra_input32);
    VERIFY_CHECK(!secp256k1_scalar_is_zero(&k[0]));
    VERIFY_CHECK(!secp256k1_scalar_is_zero(&k[1]));
    secp256k1_musig_secnonce_save(secnonce, k, &pk);
    secp256k1_musig_secnonce_invalidate(ctx, secnonce, !ret);

    /* Compute pubnonce as two gejs */
    for (i = 0; i < 2; i++) {
        secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &nonce_ptj[i], &k[i]);
        secp256k1_scalar_clear(&k[i]);
    }

    /* Batch convert to two public ges */
    secp256k1_ge_set_all_gej(nonce_pts, nonce_ptj, 2);
    for (i = 0; i < 2; i++) {
        secp256k1_gej_clear(&nonce_ptj[i]);
    }

    for (i = 0; i < 2; i++) {
        secp256k1_declassify(ctx, &nonce_pts[i], sizeof(nonce_pts[i]));
    }
    /* None of the nonce_pts will be infinity because k != 0 with overwhelming
     * probability */
    secp256k1_musig_pubnonce_save(pubnonce, nonce_pts);
    return ret;
}